

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

int omp_get_place_num_procs(int place_num)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  iVar1 = 0;
  if ((-1 < place_num) && (iVar1 = 0, place_num < (int)__kmp_affinity_num_masks)) {
    if (__kmp_affin_mask_size * 8 != 0) {
      uVar2 = 0;
      iVar1 = 0;
      do {
        uVar3 = uVar2 >> 3 & 0x1fffffff;
        uVar4 = (uint)uVar2 & 7;
        if ((__kmp_affin_fullMask[uVar3] >> uVar4 & 1) != 0) {
          iVar1 = iVar1 + (uint)((__kmp_affinity_masks
                                  [uVar3 + __kmp_affin_mask_size * (uint)place_num] >> uVar4 & 1) !=
                                0);
        }
        uVar2 = uVar2 + 1;
      } while (__kmp_affin_mask_size * 8 - uVar2 != 0);
    }
  }
  return iVar1;
}

Assistant:

int FTN_STDCALL
FTN_GET_PLACE_NUM_PROCS( int place_num )
{
    #if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
        return 0;
    #else
        int i;
        int retval = 0;
        if ( ! TCR_4(__kmp_init_middle) ) {
            __kmp_middle_initialize();
        }
        if ( place_num < 0 || place_num >= (int)__kmp_affinity_num_masks )
            return 0;
        kmp_affin_mask_t *mask = KMP_CPU_INDEX(__kmp_affinity_masks, place_num);
        KMP_CPU_SET_ITERATE(i, mask) {
            if ((! KMP_CPU_ISSET(i, __kmp_affin_fullMask)) ||
              (!KMP_CPU_ISSET(i, mask))) {
                continue;
            }
            ++retval;
        }
        return retval;
    #endif
}